

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fifo_reader.c
# Opt level: O1

int main(void)

{
  int __fd;
  ssize_t sVar1;
  char data;
  char local_19;
  
  local_19 = ' ';
  __fd = open("/tmp/myfifo",2);
  if (__fd == 0) {
    main_cold_1();
    halt_baddata();
  }
  puts("Waiting for characters.....");
  if (local_19 != '#') {
    do {
      sVar1 = read(__fd,&local_19,1);
      if (local_19 != '#' && sVar1 != 0) {
        do {
          fputc((int)local_19,_stderr);
          sVar1 = read(__fd,&local_19,1);
          if (sVar1 == 0) break;
        } while (local_19 != '#');
      }
    } while (local_19 != '#');
  }
  close(__fd);
  unlink("/tmp/myfifo");
  return 0;
}

Assistant:

int main ()
{
    char data = ' ';
    char * myfifo = "/tmp/myfifo";
    
    int fd = open(myfifo, O_RDWR);
    
    if (fd == 0) 
    {
        perror("Cannot open fifo");
        unlink(myfifo);exit(1);
        
    }
    printf("Waiting for characters.....\n");
    while (data != '#') 
    {
        while (read(fd, &data, 1) && (data != '#'))
            fprintf(stderr, "%c", data);
        
    }
    close(fd);
    unlink(myfifo);
    return 0;
    
}